

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O2

void mpack_write_utf8(mpack_writer_t *writer,char *str,uint32_t length)

{
  _Bool _Var1;
  
  _Var1 = mpack_utf8_check(str,(ulong)length);
  if (_Var1) {
    mpack_write_str(writer,str,length);
    return;
  }
  mpack_writer_flag_error(writer,mpack_error_invalid);
  return;
}

Assistant:

void mpack_write_utf8(mpack_writer_t* writer, const char* str, uint32_t length) {
    mpack_assert(str != NULL, "data for string of length %i is NULL", (int)length);
    if (!mpack_utf8_check(str, length)) {
        mpack_writer_flag_error(writer, mpack_error_invalid);
        return;
    }
    mpack_write_str(writer, str, length);
}